

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int eval_relative_location_path
              (lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,int all_desc,
              lyxp_set *set,int options)

{
  uint uVar1;
  byte bVar2;
  LYS_NODE LVar3;
  lyd_attr *plVar4;
  lyd_node *plVar5;
  uint16_t uVar6;
  lyxp_set_type lVar7;
  int iVar8;
  int iVar9;
  ly_ctx *plVar10;
  lys_module *plVar11;
  lys_node *plVar12;
  lys_node *plVar13;
  lyxp_set_nodes *plVar14;
  char *pcVar15;
  uint16_t *puVar16;
  long lVar17;
  lyxp_set *plVar18;
  lys_module *plVar19;
  lys_node *plVar20;
  lys_node *plVar21;
  ulong uVar22;
  LY_ERR *pLVar23;
  ushort uVar24;
  undefined8 uVar25;
  lyxp_token *plVar26;
  ushort uVar27;
  lyxp_node_type lVar28;
  uint uVar29;
  uint uVar30;
  ushort *puVar31;
  lyxp_token lVar32;
  uint8_t *puVar33;
  LY_ECODE code;
  ly_ctx *plVar34;
  char *pcVar35;
  lyd_attr **pplVar36;
  ly_ctx *plVar37;
  ulong uVar38;
  lyxp_expr *exp_00;
  bool bVar39;
  lyxp_node_type local_8c;
  lyxp_node_type local_88;
  lyxp_node_type local_84;
  char *local_80;
  lyxp_expr *local_78;
  ushort *local_70;
  ulong local_68;
  lys_module *local_60;
  lys_module *local_58;
  ly_ctx *local_50;
  lys_node *local_48;
  lyxp_set *local_40;
  char local_31;
  
  local_80 = "parsed";
  if (set == (lyxp_set *)0x0) {
    local_80 = "skipped";
  }
  local_31 = (options & 0x1cU) == 0 || set == (lyxp_set *)0x0;
  uVar27 = *exp_idx;
  local_78 = exp;
  local_70 = exp_idx;
  local_48 = (lys_node *)cur_node;
  local_40 = set;
  do {
    plVar26 = exp->tokens;
    uVar22 = (ulong)uVar27;
    lVar32 = plVar26[uVar22];
    iVar9 = 0x195c84;
    switch(lVar32) {
    case LYXP_TOKEN_DOT:
      if (local_31 == '\0') {
        iVar9 = moveto_snode_self(set,local_48,all_desc,options);
      }
      else {
        iVar9 = moveto_self(set,(lyd_node *)local_48,all_desc,options);
      }
      if (iVar9 != 0) {
        return iVar9;
      }
      puVar31 = local_70;
      exp_00 = local_78;
      if ('\x02' < ly_log_level) {
        uVar27 = *local_70;
LAB_001653eb:
        puVar31 = local_70;
        exp_00 = local_78;
        pcVar35 = print_token(local_78->tokens[uVar27]);
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relative_location_path",local_80,pcVar35,
                   (ulong)exp_00->expr_pos[*puVar31]);
      }
      uVar27 = *puVar31;
      break;
    case LYXP_TOKEN_DDOT:
      if (local_31 == '\0') {
        lVar7 = set->type;
        if (lVar7 != LYXP_SET_EMPTY) {
          if (lVar7 == LYXP_SET_SNODE_SET) {
            if (all_desc != 0) {
              iVar9 = moveto_snode_self(set,local_48,1,options);
              lVar7 = ~LYXP_SET_EMPTY;
              if (iVar9 != 0) goto LAB_001653c9;
            }
            plVar12 = moveto_snode_get_root(local_48,options,&local_84);
            uVar29 = set->used;
            uVar22 = 0;
            local_50 = (ly_ctx *)CONCAT44(local_50._4_4_,uVar29);
            uVar38 = 0;
            if (0 < (int)uVar29) {
              uVar38 = (ulong)uVar29;
            }
            local_58 = (lys_module *)((ulong)local_58 & 0xffffffff00000000);
            for (; uVar22 != uVar38; uVar22 = uVar22 + 1) {
              if ((set->val).nodes[uVar22].pos == 1) {
                (set->val).nodes[uVar22].pos = 0;
                if ((set->val).nodes[uVar22].type == LYXP_NODE_ELEM) {
                  plVar21 = (lys_node *)(set->val).nodes[uVar22].node;
                  plVar13 = plVar21;
                  do {
                    plVar13 = lys_parent(plVar13);
                    if (plVar13 == (lys_node *)0x0) {
                      if (plVar12 == plVar21) goto LAB_00164de0;
                      if (((options & 0x18U) == 0) ||
                         (lVar28 = LYXP_NODE_ROOT_CONFIG, (local_48->flags & 1) == 0)) {
                        lVar28 = LYXP_NODE_ROOT;
                      }
                      plVar11 = lys_node_module(plVar21);
                      plVar21 = lys_getnext((lys_node *)0x0,(lys_node *)0x0,plVar11,0);
                      plVar13 = plVar12;
                      if (plVar21 != plVar12) {
                        pLVar23 = ly_errno_location();
                        *pLVar23 = LY_EINT;
                        ly_log(LY_LLERR,"Internal error (%s:%d).",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                               ,0x153c);
                      }
                      goto LAB_00164dfa;
                    }
                  } while ((plVar13->nodetype & (LYS_USES|LYS_OUTPUT|LYS_INPUT|LYS_CASE|LYS_CHOICE))
                           != LYS_UNKNOWN);
                  lVar28 = LYXP_NODE_ELEM;
                  if (plVar12 == plVar21) {
LAB_00164de0:
                    if (((options & 0x18U) == 0) || ((local_48->flags & 1) == 0)) {
                      lVar28 = LYXP_NODE_ROOT;
                      plVar13 = plVar21;
                    }
                    else {
                      lVar28 = LYXP_NODE_ROOT_CONFIG;
                      plVar13 = plVar21;
                    }
LAB_00164dfa:
                    if ((lVar28 != local_84) || (plVar13 != plVar12)) {
                      __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                                    ,0x1546,
                                    "int moveto_snode_parent(struct lyxp_set *, struct lys_node *, int, int)"
                                   );
                    }
                  }
                  set = local_40;
                  iVar9 = set_snode_insert_node(local_40,plVar13,lVar28);
                  if ((long)uVar22 < (long)iVar9 && iVar9 < (int)(uint)local_50) {
                    (set->val).nodes[iVar9].pos = 2;
                    local_58 = (lys_module *)CONCAT44(local_58._4_4_,1);
                  }
                }
              }
            }
            lVar7 = LYXP_SET_EMPTY;
            if ((lyxp_node_type)local_58 != 0) {
              for (lVar17 = 0; uVar38 * 0x10 != lVar17; lVar17 = lVar17 + 0x10) {
                if (*(int *)((long)&((set->val).nodes)->pos + lVar17) == 2) {
                  *(undefined4 *)((long)&((set->val).nodes)->pos + lVar17) = 1;
                }
              }
            }
          }
          else {
LAB_00164f99:
            pcVar35 = print_set_type(set);
            ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar35);
            lVar7 = ~LYXP_SET_EMPTY;
          }
        }
      }
      else if (set == (lyxp_set *)0x0) {
LAB_001653c6:
        lVar7 = LYXP_SET_EMPTY;
      }
      else {
        lVar7 = set->type;
        if (lVar7 != LYXP_SET_EMPTY) {
          if (lVar7 != LYXP_SET_NODE_SET) goto LAB_00164f99;
          if ((all_desc == 0) ||
             (lVar7 = moveto_self(set,(lyd_node *)local_48,1,options), lVar7 == LYXP_SET_EMPTY)) {
            local_50 = (ly_ctx *)moveto_get_root((lyd_node *)local_48,options,&local_88);
            uVar29 = 0;
            local_58 = (lys_module *)CONCAT44(local_58._4_4_,local_88);
LAB_00164969:
LAB_0016496c:
            do {
              if (set->used <= uVar29) {
                iVar9 = set_sort(set,(lyd_node *)local_48,options);
                if (1 < iVar9) {
                  pLVar23 = ly_errno_location();
                  *pLVar23 = LY_EINT;
                  ly_log(LY_LLERR,"XPath set was expected to be sorted, but is not (%s).",
                         "moveto_parent");
                }
                uVar29 = set->used;
                if (uVar29 < 2) goto LAB_001653c6;
                bVar39 = true;
                uVar30 = 0;
                goto LAB_0016536d;
              }
              plVar37 = (ly_ctx *)(set->val).nodes[uVar29].node;
              lVar28 = (set->val).nodes[uVar29].type;
              if (lVar28 == LYXP_NODE_ATTR) {
                plVar10 = (ly_ctx *)lyd_attr_parent((lyd_node *)local_50,(lyd_attr *)plVar37);
                if (plVar10 == (ly_ctx *)0x0) {
                  pLVar23 = ly_errno_location();
                  *pLVar23 = LY_EINT;
                  ly_log(LY_LLERR,"Internal error (%s:%d).",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                         ,0x14b8);
                  lVar7 = ~LYXP_SET_EMPTY;
                  set = local_40;
                  break;
                }
              }
              else {
                plVar10 = plVar37;
                if (lVar28 != LYXP_NODE_TEXT) {
                  if (lVar28 != LYXP_NODE_ELEM) {
                    set_remove_node(set,uVar29);
                    goto LAB_0016496c;
                  }
                  plVar10 = (ly_ctx *)((lyd_val *)&(plVar37->dict).recs[1].field_0x10)->enm;
                }
              }
              plVar34 = local_50;
              if ((((options & 2U) != 0) && (plVar10 != (ly_ctx *)0x0)) &&
                 (((ulong)(plVar10->dict).recs[0].value & 0xe00) == 0x800)) {
                lVar7 = LYXP_SET_NODE_SET;
                set = local_40;
                break;
              }
              if (local_50 == plVar37) {
                plVar34 = plVar37;
                if ((options == 0) || ((local_48->name[0x18] & 1U) == 0)) {
                  lVar28 = LYXP_NODE_ROOT;
                }
                else {
                  lVar28 = LYXP_NODE_ROOT_CONFIG;
                }
LAB_00164a6a:
                if ((lVar28 != (lyxp_node_type)local_58) ||
                   (plVar10 = plVar34, lVar28 = (lyxp_node_type)local_58, plVar34 != local_50)) {
                  __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                                ,0x14e3,
                                "int moveto_parent(struct lyxp_set *, struct lyd_node *, int, int)")
                  ;
                }
              }
              else {
                lVar28 = LYXP_NODE_ELEM;
                if (plVar10 == (ly_ctx *)0x0) {
                  if ((options == 0) ||
                     (lVar28 = LYXP_NODE_ROOT_CONFIG, (local_48->name[0x18] & 1U) == 0)) {
                    lVar28 = LYXP_NODE_ROOT;
                  }
                  do {
                    plVar10 = plVar37;
                    plVar37 = (ly_ctx *)(plVar10->dict).recs[1].value;
                  } while ((plVar37->dict).recs[1].next != (dict_rec *)0x0);
                  if (plVar10 != local_50) {
                    pLVar23 = ly_errno_location();
                    *pLVar23 = LY_EINT;
                    ly_log(LY_LLERR,"Internal error (%s:%d).",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                           ,0x14d9);
                  }
                  goto LAB_00164a6a;
                }
              }
              set = local_40;
              iVar9 = set_dup_node_check(local_40,plVar10,lVar28,-1);
              if (iVar9 < 0) goto LAB_00164ab1;
              set_remove_node(set,uVar29);
            } while( true );
          }
        }
      }
LAB_001653c9:
      if (lVar7 != LYXP_SET_EMPTY) {
        return lVar7;
      }
      uVar27 = *local_70;
      puVar31 = local_70;
      exp_00 = local_78;
      if ('\x02' < ly_log_level) goto LAB_001653eb;
      break;
    case LYXP_TOKEN_AT:
      iVar9 = 0x195c84;
      if ('\x02' < ly_log_level) {
        iVar9 = 0x1958e6;
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relative_location_path",local_80,"@",
                   (ulong)exp->expr_pos[uVar22]);
        uVar27 = *exp_idx;
        plVar26 = exp->tokens;
      }
      *exp_idx = uVar27 + 1;
      uVar22 = (ulong)(ushort)(uVar27 + 1);
      lVar32 = plVar26[uVar22];
      bVar39 = false;
      goto LAB_00164b50;
    default:
      pLVar23 = ly_errno_location();
      *pLVar23 = LY_EINT;
      uVar25 = 0x17ee;
LAB_00165ad3:
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",
             uVar25);
      return -1;
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
      bVar39 = true;
LAB_00164b50:
      plVar12 = local_48;
      if (lVar32 == LYXP_TOKEN_NODETYPE) {
        pcVar35 = "skipped";
        if (set != (lyxp_set *)0x0) {
          if (exp->tok_len[uVar22] != '\x04') {
            __assert_fail("exp->tok_len[*exp_idx] == 4",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                          ,0x168e,
                          "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                         );
          }
          lVar7 = local_40->type;
          if (lVar7 == LYXP_SET_SNODE_SET) {
            set_snode_clear_ctx(local_40);
            pcVar35 = "skipped";
          }
          else {
            uVar27 = exp->expr_pos[uVar22];
            pcVar35 = exp->expr;
            iVar9 = strncmp(pcVar35 + uVar27,"node",4);
            if (iVar9 == 0) {
              pcVar35 = "parsed";
              if (lVar7 != LYXP_SET_NODE_SET) {
                lyxp_set_cast(local_40,LYXP_SET_EMPTY,(lyd_node *)local_48,param_4,options);
LAB_001650ab:
                pcVar35 = "parsed";
              }
            }
            else {
              iVar9 = strncmp(pcVar35 + uVar27,"text",4);
              plVar18 = local_40;
              if (iVar9 != 0) {
                __assert_fail("!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], \"text\", 4)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                              ,0x1699,
                              "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                             );
              }
              pcVar35 = "parsed";
              if (lVar7 != LYXP_SET_EMPTY) {
                if (lVar7 == LYXP_SET_NODE_SET) {
                  uVar29 = 0;
LAB_00164eef:
LAB_00164ef1:
                  do {
                    if (plVar18->used <= uVar29) goto LAB_001650ab;
                    lVar28 = (plVar18->val).nodes[uVar29].type;
                  } while (LYXP_NODE_ATTR < lVar28);
                  if (lVar28 == LYXP_NODE_ELEM) {
                    plVar14 = (plVar18->val).nodes + uVar29;
                    plVar5 = plVar14->node;
                    if ((char)plVar5->validity < '\0') {
                      ly_vlog(LYE_XPATH_DUMMY,LY_VLOG_LYD,plVar5,plVar5->schema->name);
                      return -1;
                    }
                    if (((plVar5->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
                       (plVar5->child != (lyd_node *)0x0)) goto code_r0x00164f40;
                  }
                  set_remove_node(plVar18,uVar29);
                  goto LAB_00164ef1;
                }
                pcVar35 = print_set_type(local_40);
                pcVar15 = "text()";
                code = LYE_XPATH_INCTX;
                goto LAB_00165b27;
              }
            }
          }
        }
        uVar27 = *exp_idx;
        if ('\x02' < ly_log_level) {
          pcVar15 = print_token(exp->tokens[uVar27]);
          ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_node_test",pcVar35,pcVar15,
                     (ulong)exp->expr_pos[*exp_idx]);
          uVar27 = *exp_idx;
        }
        uVar27 = uVar27 + 1;
        *exp_idx = uVar27;
        if ('\x02' < ly_log_level) {
          pcVar15 = print_token(exp->tokens[uVar27]);
          ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_node_test",pcVar35,pcVar15,
                     (ulong)exp->expr_pos[*exp_idx]);
          uVar27 = *exp_idx;
        }
        uVar6 = uVar27 + 1;
        *exp_idx = uVar6;
        exp_00 = exp;
        set = local_40;
      }
      else {
        if (lVar32 != LYXP_TOKEN_NAMETEST) {
          pLVar23 = ly_errno_location();
          *pLVar23 = LY_EINT;
          uVar25 = 0x16b0;
          goto LAB_00165ad3;
        }
        if (bVar39) {
          if (all_desc == 0) {
            if (set == (lyxp_set *)0x0) {
              pcVar35 = exp->expr;
              puVar16 = exp->expr_pos;
              puVar33 = exp->tok_len;
            }
            else {
              pcVar35 = exp->expr;
              puVar16 = exp->expr_pos;
              puVar33 = exp->tok_len;
              if (set->type == LYXP_SET_SNODE_SET) {
                lVar7 = moveto_snode(set,local_48,pcVar35 + puVar16[uVar22],(ushort)puVar33[uVar22],
                                     options);
                goto LAB_001659d5;
              }
            }
            lVar7 = moveto_node(set,(lyd_node *)local_48,pcVar35 + puVar16[uVar22],
                                (ushort)puVar33[uVar22],options);
          }
          else {
            pcVar35 = exp->expr + exp->expr_pos[uVar22];
            uVar29 = (uint)exp->tok_len[uVar22];
            uVar27 = (ushort)exp->tok_len[uVar22];
            set = local_40;
            if (local_31 == '\0') {
              lVar7 = local_40->type;
              if (lVar7 != LYXP_SET_EMPTY) {
                if (lVar7 == LYXP_SET_SNODE_SET) {
                  local_50 = local_48->module->ctx;
                  moveto_snode_get_root(local_48,options,&local_8c);
                  uVar30 = (uint)uVar27;
                  iVar9 = options;
                  iVar8 = moveto_snode(local_40,plVar12,pcVar35,uVar27,options);
                  lVar7 = ~LYXP_SET_EMPTY;
                  set = local_40;
                  if (iVar8 == 0) {
                    pcVar15 = strnchr(pcVar35,0x3a,uVar30);
                    if (pcVar15 == (char *)0x0) {
                      local_60 = (lys_module *)0x0;
                    }
                    else {
                      pcVar15 = strnchr(pcVar35,0x3a,uVar30);
                      uVar29 = (int)pcVar15 - (int)pcVar35;
                      local_60 = moveto_resolve_model
                                           (pcVar35,(uint16_t)uVar29,local_50,local_48,iVar9);
                      if (local_60 == (lys_module *)0x0) {
                        ly_vlog(LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)uVar29,pcVar35);
                        set = local_40;
                        goto LAB_001659d5;
                      }
                      pcVar35 = pcVar35 + (long)(int)uVar29 + 1;
                      uVar29 = ~uVar29 + uVar30;
                    }
                    local_58 = (lys_module *)CONCAT71(local_58._1_7_,1);
                    if ((short)uVar29 == 1) {
                      local_58 = (lys_module *)CONCAT71(local_58._1_7_,*pcVar35 != '*');
                    }
                    local_68 = (ulong)(uVar29 & 0xffff);
                    uVar29 = local_40->used;
                    if ((int)local_40->used < 1) {
                      uVar29 = 0;
                    }
                    local_50 = (ly_ctx *)(ulong)uVar29;
                    plVar18 = local_40;
                    for (plVar37 = (ly_ctx *)0x0; plVar37 != local_50;
                        plVar37 = (ly_ctx *)((long)&(plVar37->dict).recs[0].next + 1)) {
                      if ((plVar18->val).nodes[(long)plVar37].pos == 1) {
                        plVar12 = (lys_node *)(plVar18->val).nodes[(long)plVar37].node;
                        plVar21 = plVar12;
                        while (plVar11 = local_60, plVar18 = local_40, plVar21 != (lys_node *)0x0) {
                          if ((local_8c == LYXP_NODE_ROOT_CONFIG) && ((plVar21->flags & 2) != 0))
                          goto LAB_00165975;
                          LVar3 = plVar21->nodetype;
                          if ((LVar3 == LYS_CHOICE) || ((LVar3 == LYS_CASE || (LVar3 == LYS_USES))))
                          goto LAB_00165959;
                          if (LVar3 == LYS_OUTPUT) {
                            if ((options & 0x20U) != 0) goto LAB_00165959;
                          }
                          else if (LVar3 != LYS_GROUPING) {
                            if (LVar3 == LYS_INPUT) {
                              if ((options & 0x20U) == 0) goto LAB_00165959;
                            }
                            else {
                              if (local_60 == (lys_module *)0x0) {
                                bVar39 = false;
                              }
                              else {
                                plVar19 = lys_node_module(plVar21);
                                bVar39 = plVar19 != plVar11;
                              }
                              if ((char)local_58 == '\0') {
LAB_001658d1:
                                plVar18 = local_40;
                                if (bVar39 || plVar21 == plVar12) goto LAB_001658de;
                                uVar29 = set_snode_dup_node_check
                                                   (local_40,plVar21,LYXP_NODE_ELEM,(int)plVar37);
                                if ((int)uVar29 < 0) {
                                  set_snode_insert_node(plVar18,plVar21,LYXP_NODE_ELEM);
                                }
                                else {
                                  (plVar18->val).nodes[(long)(ulong)uVar29].pos = 1;
                                  if (plVar37 < (ly_ctx *)(ulong)uVar29) goto LAB_00165975;
                                }
                              }
                              else {
                                pcVar15 = plVar21->name;
                                iVar9 = strncmp(pcVar15,pcVar35,local_68);
                                if ((iVar9 == 0) && (pcVar15[local_68] == '\0')) goto LAB_001658d1;
                                bVar39 = true;
LAB_001658de:
                                plVar18 = local_40;
                                if ((bool)(plVar21 == plVar12 & bVar39)) {
                                  pLVar23 = ly_errno_location();
                                  *pLVar23 = LY_EINT;
                                  ly_log(LY_LLERR,"Internal error (%s:%d).",
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                                         ,0x12eb);
                                }
                              }
LAB_00165959:
                              plVar13 = plVar21;
                              plVar20 = plVar21->child;
                              if (plVar21->child != (lys_node *)0x0 &&
                                  (plVar21->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) ==
                                  LYS_UNKNOWN) goto LAB_0016597e;
                            }
                          }
LAB_00165975:
                          if (plVar21 == plVar12) break;
                          while( true ) {
                            plVar13 = plVar21;
                            plVar20 = plVar21->next;
LAB_0016597e:
                            plVar21 = plVar20;
                            if ((plVar21 != (lys_node *)0x0) ||
                               (plVar20 = lys_parent(plVar13), plVar20 == plVar12)) break;
                            plVar21 = lys_parent(plVar13);
                          }
                        }
                      }
                    }
                    lVar7 = LYXP_SET_EMPTY;
                    set = local_40;
                  }
                }
                else {
                  pcVar35 = print_set_type(local_40);
                  ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar35);
                  lVar7 = ~LYXP_SET_EMPTY;
                  set = local_40;
                }
              }
            }
            else {
              lVar7 = moveto_node_alldesc(local_40,(lyd_node *)local_48,pcVar35,uVar27,options);
            }
          }
LAB_001659d5:
          if ((set == (lyxp_set *)0x0) || (lVar7 != LYXP_SET_EMPTY)) {
            if (lVar7 != LYXP_SET_EMPTY) {
              return lVar7;
            }
          }
          else if ((options & 0x1cU) != 0) {
            uVar22 = (ulong)set->used;
            do {
              uVar22 = uVar22 - 1;
              if ((int)(uint)uVar22 < 0) {
                if (uVar22 == 0xffffffffffffffff) {
                  ly_vlog(LYE_XPATH_INSNODE,LY_VLOG_NONE,(void *)0x0,
                          (ulong)local_78->tok_len[*local_70],
                          local_78->expr + local_78->expr_pos[*local_70],
                          (ulong)((uint)local_78->expr_pos[*local_70] +
                                 (uint)local_78->tok_len[*local_70]),local_78->expr);
                  return -1;
                }
                break;
              }
            } while ((set->val).nodes[(uint)uVar22 & 0x7fffffff].pos == 0);
          }
        }
        else if (local_31 == '\0') {
          set_snode_clear_ctx(set);
        }
        else {
          plVar11 = (lys_module *)(exp->expr + exp->expr_pos[uVar22]);
          bVar2 = exp->tok_len[uVar22];
          uVar29 = (uint)bVar2;
          local_60 = plVar11;
          if (all_desc == 0) {
            if ((set != (lyxp_set *)0x0) && (set->type != LYXP_SET_EMPTY)) {
              if (set->type != LYXP_SET_NODE_SET) goto LAB_00165b0e;
              pcVar35 = strnchr((char *)plVar11,0x3a,(uint)bVar2);
              if ((local_48 == (lys_node *)0x0) || (pcVar35 == (char *)0x0)) {
                plVar19 = (lys_module *)0x0;
              }
              else {
                pcVar35 = strnchr((char *)plVar11,0x3a,(uint)bVar2);
                plVar19 = moveto_resolve_model
                                    ((char *)plVar11,(uint16_t)((long)pcVar35 - (long)plVar11),
                                     (ly_ctx *)**(undefined8 **)(local_48->name + 0x30),
                                     (lys_node *)0x0,iVar9);
                if (plVar19 == (lys_module *)0x0) {
                  pLVar23 = ly_errno_location();
                  *pLVar23 = LY_EINT;
                  uVar25 = 0x1331;
                  goto LAB_00165ad3;
                }
                uVar29 = (uint)((long)pcVar35 - (long)plVar11);
                plVar11 = (lys_module *)((long)&plVar11->ctx + (long)(int)uVar29 + 1);
                uVar29 = ~uVar29 + (uint)bVar2;
                set = local_40;
              }
              local_50 = (ly_ctx *)CONCAT71(local_50._1_7_,1);
              if ((short)uVar29 == 1) {
                local_50 = (ly_ctx *)CONCAT71(local_50._1_7_,*(char *)&plVar11->ctx != '*');
              }
              local_68 = (ulong)(uVar29 & 0xffff);
              uVar22 = 0;
              local_60 = plVar11;
              local_58 = plVar19;
LAB_00165678:
              if ((uint)uVar22 < set->used) {
                if (((set->val).nodes[uVar22].type == LYXP_NODE_ELEM) &&
                   (plVar5 = (set->val).nodes[uVar22].node, -1 < (char)plVar5->validity))
                goto code_r0x001656aa;
                goto LAB_00165760;
              }
            }
          }
          else if ((set != (lyxp_set *)0x0) && (set->type != LYXP_SET_EMPTY)) {
            if (set->type != LYXP_SET_NODE_SET) {
LAB_00165b0e:
              pcVar15 = print_set_type(set);
              pcVar35 = "path operator";
              code = LYE_XPATH_INOP_1;
LAB_00165b27:
              ly_vlog(code,LY_VLOG_NONE,(void *)0x0,pcVar35,pcVar15);
              return -1;
            }
            pcVar35 = strnchr((char *)plVar11,0x3a,(uint)bVar2);
            if (pcVar35 == (char *)0x0) {
              plVar19 = (lys_module *)0x0;
            }
            else {
              pcVar35 = strnchr((char *)plVar11,0x3a,(uint)bVar2);
              plVar19 = moveto_resolve_model
                                  ((char *)plVar11,(uint16_t)((long)pcVar35 - (long)plVar11),
                                   (ly_ctx *)**(undefined8 **)(local_48->name + 0x30),
                                   (lys_node *)0x0,iVar9);
              if (plVar19 == (lys_module *)0x0) {
                pLVar23 = ly_errno_location();
                *pLVar23 = LY_EINT;
                uVar25 = 0x13b8;
                goto LAB_00165ad3;
              }
              uVar29 = (uint)((long)pcVar35 - (long)plVar11);
              local_60 = (lys_module *)((long)&plVar11->ctx + (long)(int)uVar29 + 1);
              uVar29 = ~uVar29 + (uint)bVar2;
              set = local_40;
            }
            plVar18 = set_copy(set);
            plVar12 = local_48;
            iVar9 = moveto_node_alldesc(plVar18,(lyd_node *)local_48,"*",1,options);
            if (iVar9 != 0) {
              lyxp_set_free(plVar18);
              return iVar9;
            }
            iVar9 = moveto_union(local_40,plVar18,(lyd_node *)plVar12,options);
            lyxp_set_free(plVar18);
            if (iVar9 != 0) {
              return -1;
            }
            bVar39 = true;
            if ((short)uVar29 == 1) {
              bVar39 = *(char *)&local_60->ctx != '*';
            }
            local_68 = (ulong)(uVar29 & 0xffff);
            uVar29 = 0;
            uVar22 = local_68;
            set = local_40;
LAB_0016553b:
            if (uVar29 < set->used) {
              if ((set->val).nodes[uVar29].type == LYXP_NODE_ELEM) goto code_r0x0016555b;
              goto LAB_00165635;
            }
          }
        }
        uVar6 = *local_70;
        pcVar35 = local_80;
        exp_idx = local_70;
        exp_00 = local_78;
      }
      if ('\x02' < ly_log_level) {
        pcVar15 = print_token(exp_00->tokens[uVar6]);
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_node_test",pcVar35,pcVar15,
                   (ulong)exp_00->expr_pos[*exp_idx]);
        uVar6 = *exp_idx;
      }
      *exp_idx = uVar6 + 1;
      while( true ) {
        uVar24 = exp_00->used;
        uVar27 = *exp_idx;
        if ((uVar24 <= uVar27) || (exp_00->tokens[uVar27] != LYXP_TOKEN_BRACK1)) break;
        iVar9 = eval_predicate(exp_00,exp_idx,(lyd_node *)local_48,param_4,set,options);
        if (iVar9 != 0) {
          return iVar9;
        }
      }
      goto LAB_00165431;
    }
    uVar27 = uVar27 + 1;
    *puVar31 = uVar27;
    uVar24 = exp_00->used;
LAB_00165431:
    exp_idx = local_70;
    exp = local_78;
    if (uVar24 <= uVar27) {
      return 0;
    }
    if (exp_00->tokens[uVar27] != LYXP_TOKEN_OPERATOR_PATH) {
      return 0;
    }
    all_desc = 0;
    if (local_78->tok_len[uVar27] != '\x01') {
      if (local_78->tok_len[uVar27] != '\x02') {
        __assert_fail("exp->tok_len[*exp_idx] == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0x17b0,
                      "int eval_relative_location_path(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, struct lyxp_set *, int)"
                     );
      }
      all_desc = 1;
    }
    if ('\x02' < ly_log_level) {
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relative_location_path",local_80,
                 "Operator(Path)",(ulong)local_78->expr_pos[uVar27]);
      uVar27 = *exp_idx;
    }
    uVar27 = uVar27 + 1;
    *exp_idx = uVar27;
  } while( true );
code_r0x00164f40:
  plVar14->type = LYXP_NODE_TEXT;
  uVar29 = uVar29 + 1;
  goto LAB_00164eef;
code_r0x001656aa:
  bVar39 = false;
  pplVar36 = &plVar5->attr;
  plVar11 = local_58;
  while (uVar38 = local_68, plVar4 = *pplVar36, plVar4 != (lyd_attr *)0x0) {
    if ((plVar11 == (lys_module *)0x0) || (plVar4->annotation->module == plVar11)) {
      if ((char)local_50 != '\0') {
        pcVar35 = plVar4->name;
        iVar9 = strncmp(pcVar35,(char *)local_60,local_68);
        plVar11 = local_58;
        set = local_40;
        if ((iVar9 != 0) || (pcVar35[uVar38] != '\0')) goto LAB_0016574e;
      }
      if (bVar39) {
        set_insert_node(set,plVar4,(set->val).nodes[uVar22].pos,LYXP_NODE_ATTR,(int)uVar22 + 1);
      }
      else {
        (set->val).nodes[uVar22].node = (lyd_node *)plVar4;
        (set->val).nodes[uVar22].type = LYXP_NODE_ATTR;
      }
      uVar22 = (ulong)((int)uVar22 + 1);
      bVar39 = true;
    }
LAB_0016574e:
    pplVar36 = &plVar4->next;
  }
  if (!bVar39) {
LAB_00165760:
    set_remove_node(set,(uint32_t)uVar22);
  }
  goto LAB_00165678;
code_r0x0016555b:
  iVar9 = 0;
  pplVar36 = &((set->val).nodes[uVar29].node)->attr;
  while (plVar4 = *pplVar36, plVar4 != (lyd_attr *)0x0) {
    if ((plVar19 == (lys_module *)0x0) || (plVar4->annotation->module == plVar19)) {
      if (bVar39) {
        local_58 = (lys_module *)CONCAT44(local_58._4_4_,iVar9);
        local_50 = (ly_ctx *)CONCAT44(local_50._4_4_,uVar29);
        pcVar35 = plVar4->name;
        iVar8 = strncmp(pcVar35,(char *)local_60,uVar22);
        uVar29 = (uint)local_50;
        iVar9 = (lyxp_node_type)local_58;
        if ((iVar8 != 0) || (pcVar35[uVar22] != '\0')) goto LAB_0016561f;
      }
      if (iVar9 == 0) {
        (local_40->val).nodes[uVar29].node = (lyd_node *)plVar4;
        (local_40->val).nodes[uVar29].type = LYXP_NODE_ATTR;
      }
      else {
        set_insert_node(local_40,plVar4,(local_40->val).nodes[uVar29].pos,LYXP_NODE_ATTR,uVar29 + 1)
        ;
        uVar22 = local_68;
      }
      uVar29 = uVar29 + 1;
      iVar9 = 1;
    }
LAB_0016561f:
    pplVar36 = &plVar4->next;
  }
  set = local_40;
  if (iVar9 == 0) {
LAB_00165635:
    set_remove_node(set,uVar29);
    uVar22 = local_68;
  }
  goto LAB_0016553b;
LAB_0016536d:
  uVar22 = (ulong)uVar30 << 4 | 8;
  while( true ) {
    if (uVar29 - 1 <= uVar30) {
      if (bVar39) goto LAB_001653c6;
      pLVar23 = ly_errno_location();
      *pLVar23 = LY_EINT;
      lVar7 = LYXP_SET_EMPTY;
      ly_log(LY_LLERR,"XPath set includes duplicates (%s).","moveto_parent");
      goto LAB_001653c9;
    }
    plVar14 = (set->val).nodes;
    uVar1 = uVar30 + 1;
    if ((*(lyd_node **)((long)plVar14 + (uVar22 - 8)) == plVar14[uVar1].node) &&
       (*(lyxp_node_type *)((long)&plVar14->node + uVar22) == plVar14[uVar1].type)) break;
    uVar22 = uVar22 + 0x10;
    uVar30 = uVar1;
  }
  set_remove_node(set,uVar30 + 1);
  uVar29 = set->used;
  bVar39 = false;
  goto LAB_0016536d;
LAB_00164ab1:
  (set->val).nodes[uVar29].node = (lyd_node *)plVar10;
  (set->val).nodes[uVar29].type = lVar28;
  (set->val).nodes[uVar29].pos = 0;
  uVar29 = uVar29 + 1;
  goto LAB_00164969;
}

Assistant:

static int
eval_relative_location_path(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                            int all_desc, struct lyxp_set *set, int options)
{
    int attr_axis, ret;

    goto step;
    do {
        /* evaluate '/' or '//' */
        if (exp->tok_len[*exp_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*exp_idx] == 2);
            all_desc = 1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

step:
        /* Step */
        attr_axis = 0;
        switch (exp->tokens[*exp_idx]) {
        case LYXP_TOKEN_DOT:
            /* evaluate '.' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_self(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_self(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;
        case LYXP_TOKEN_DDOT:
            /* evaluate '..' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_parent(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_parent(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_AT:
            /* evaluate '@' */
            attr_axis = 1;
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);

            /* fall through */
        case LYXP_TOKEN_NAMETEST:
        case LYXP_TOKEN_NODETYPE:
            ret = eval_node_test(exp, exp_idx, cur_node, local_mod, attr_axis, all_desc, set, options);
            if (ret) {
                return ret;
            }
            while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
                ret = eval_predicate(exp, exp_idx, cur_node, local_mod, set, options);
                if (ret) {
                    return ret;
                }
            }
            break;
        default:
            LOGINT;
            return -1;
        }
    } while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH));

    return EXIT_SUCCESS;
}